

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O0

void __thiscall Tle::Initialize(Tle *this)

{
  bool bVar1;
  TleException *pTVar2;
  char *pcVar3;
  ulong uVar4;
  DateTime local_240;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  double local_b8;
  double day;
  string local_a8 [4];
  uint year;
  string local_88 [32];
  string local_68;
  string local_48;
  uint local_24;
  uint local_20;
  uint sat_number_2;
  uint sat_number_1;
  Tle *local_10;
  Tle *this_local;
  
  local_10 = this;
  bVar1 = IsValidLineLength(&this->line_one_);
  if (!bVar1) {
    pTVar2 = (TleException *)__cxa_allocate_exception(0x10);
    TleException::TleException(pTVar2,"Invalid length for line one");
    __cxa_throw(pTVar2,&TleException::typeinfo,TleException::~TleException);
  }
  bVar1 = IsValidLineLength(&this->line_two_);
  if (!bVar1) {
    pTVar2 = (TleException *)__cxa_allocate_exception(0x10);
    TleException::TleException(pTVar2,"Invalid length for line two");
    __cxa_throw(pTVar2,&TleException::typeinfo,TleException::~TleException);
  }
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->line_one_);
  if (*pcVar3 != '1') {
    pTVar2 = (TleException *)__cxa_allocate_exception(0x10);
    TleException::TleException(pTVar2,"Invalid line beginning for line one");
    __cxa_throw(pTVar2,&TleException::typeinfo,TleException::~TleException);
  }
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->line_two_);
  if (*pcVar3 == '2') {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&this->line_one_);
    ExtractInteger(this,&local_48,&local_20);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::substr((ulong)&local_68,(ulong)&this->line_two_);
    ExtractInteger(this,&local_68,&local_24);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_20 == local_24) {
      this->norad_number_ = local_20;
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::__cxx11::string::substr((ulong)local_88,(ulong)&this->line_one_);
        std::__cxx11::string::operator=((string *)this,local_88);
        std::__cxx11::string::~string(local_88);
      }
      std::__cxx11::string::substr((ulong)local_a8,(ulong)&this->line_one_);
      std::__cxx11::string::operator=((string *)&this->int_designator_,local_a8);
      std::__cxx11::string::~string(local_a8);
      day._4_4_ = 0;
      local_b8 = 0.0;
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)&this->line_one_);
      ExtractInteger(this,&local_d8,(uint *)((long)&day + 4));
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::substr((ulong)&local_f8,(ulong)&this->line_one_);
      ExtractDouble(this,&local_f8,4,&local_b8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::substr((ulong)&local_118,(ulong)&this->line_one_);
      ExtractDouble(this,&local_118,2,&this->mean_motion_dt2_);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::substr((ulong)&local_138,(ulong)&this->line_one_);
      ExtractExponential(this,&local_138,&this->mean_motion_ddt6_);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::substr((ulong)&local_158,(ulong)&this->line_one_);
      ExtractExponential(this,&local_158,&this->bstar_);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::substr((ulong)&local_178,(ulong)&this->line_two_);
      ExtractDouble(this,&local_178,4,&this->inclination_);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::substr((ulong)&local_198,(ulong)&this->line_two_);
      ExtractDouble(this,&local_198,4,&this->right_ascending_node_);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&this->line_two_);
      ExtractDouble(this,&local_1b8,-1,&this->eccentricity_);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::substr((ulong)&local_1d8,(ulong)&this->line_two_);
      ExtractDouble(this,&local_1d8,4,&this->argument_perigee_);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::substr((ulong)&local_1f8,(ulong)&this->line_two_);
      ExtractDouble(this,&local_1f8,4,&this->mean_anomaly_);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::substr((ulong)&local_218,(ulong)&this->line_two_);
      ExtractDouble(this,&local_218,3,&this->mean_motion_);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::substr((ulong)&local_238,(ulong)&this->line_two_);
      ExtractInteger(this,&local_238,&this->orbit_number_);
      std::__cxx11::string::~string((string *)&local_238);
      if (day._4_4_ < 0x39) {
        day._4_4_ = day._4_4_ + 2000;
      }
      else {
        day._4_4_ = day._4_4_ + 0x76c;
      }
      DateTime::DateTime(&local_240,day._4_4_,local_b8);
      (this->epoch_).m_encoded = local_240.m_encoded;
      return;
    }
    pTVar2 = (TleException *)__cxa_allocate_exception(0x10);
    TleException::TleException(pTVar2,"Satellite numbers do not match");
    __cxa_throw(pTVar2,&TleException::typeinfo,TleException::~TleException);
  }
  pTVar2 = (TleException *)__cxa_allocate_exception(0x10);
  TleException::TleException(pTVar2,"Invalid line beginning for line two");
  __cxa_throw(pTVar2,&TleException::typeinfo,TleException::~TleException);
}

Assistant:

void Tle::Initialize()
{
    if (!IsValidLineLength(line_one_))
    {
        throw TleException("Invalid length for line one");
    }

    if (!IsValidLineLength(line_two_))
    {
        throw TleException("Invalid length for line two");
    }

    if (line_one_[0] != '1')
    {
        throw TleException("Invalid line beginning for line one");
    }
        
    if (line_two_[0] != '2')
    {
        throw TleException("Invalid line beginning for line two");
    }

    unsigned int sat_number_1;
    unsigned int sat_number_2;

    ExtractInteger(line_one_.substr(TLE1_COL_NORADNUM,
                TLE1_LEN_NORADNUM), sat_number_1);
    ExtractInteger(line_two_.substr(TLE2_COL_NORADNUM,
                TLE2_LEN_NORADNUM), sat_number_2);

    if (sat_number_1 != sat_number_2)
    {
        throw TleException("Satellite numbers do not match");
    }

    norad_number_ = sat_number_1;

    if (name_.empty())
    {
        name_ = line_one_.substr(TLE1_COL_NORADNUM, TLE1_LEN_NORADNUM);
    }

    int_designator_ = line_one_.substr(TLE1_COL_INTLDESC_A,
            TLE1_LEN_INTLDESC_A + TLE1_LEN_INTLDESC_B + TLE1_LEN_INTLDESC_C);

    unsigned int year = 0;
    double day = 0.0;

    ExtractInteger(line_one_.substr(TLE1_COL_EPOCH_A,
                TLE1_LEN_EPOCH_A), year);
    ExtractDouble(line_one_.substr(TLE1_COL_EPOCH_B,
                TLE1_LEN_EPOCH_B), 4, day);
    ExtractDouble(line_one_.substr(TLE1_COL_MEANMOTIONDT2,
                TLE1_LEN_MEANMOTIONDT2), 2, mean_motion_dt2_);
    ExtractExponential(line_one_.substr(TLE1_COL_MEANMOTIONDDT6,
                TLE1_LEN_MEANMOTIONDDT6), mean_motion_ddt6_);
    ExtractExponential(line_one_.substr(TLE1_COL_BSTAR,
                TLE1_LEN_BSTAR), bstar_);

    /*
     * line 2
     */
    ExtractDouble(line_two_.substr(TLE2_COL_INCLINATION,
                TLE2_LEN_INCLINATION), 4, inclination_);
    ExtractDouble(line_two_.substr(TLE2_COL_RAASCENDNODE,
                TLE2_LEN_RAASCENDNODE), 4, right_ascending_node_);
    ExtractDouble(line_two_.substr(TLE2_COL_ECCENTRICITY,
                TLE2_LEN_ECCENTRICITY), -1, eccentricity_);
    ExtractDouble(line_two_.substr(TLE2_COL_ARGPERIGEE,
                TLE2_LEN_ARGPERIGEE), 4, argument_perigee_);
    ExtractDouble(line_two_.substr(TLE2_COL_MEANANOMALY,
                TLE2_LEN_MEANANOMALY), 4, mean_anomaly_);
    ExtractDouble(line_two_.substr(TLE2_COL_MEANMOTION,
                TLE2_LEN_MEANMOTION), 3, mean_motion_);
    ExtractInteger(line_two_.substr(TLE2_COL_REVATEPOCH,
                TLE2_LEN_REVATEPOCH), orbit_number_);
    
    if (year < 57)
        year += 2000;
    else
        year += 1900;

    epoch_ = DateTime(year, day);
}